

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::possiblyUseLiDualSteepestEdge(HEkkDual *this)

{
  HEkk *pHVar1;
  HighsOptions *pHVar2;
  bool bVar3;
  
  pHVar1 = this->ekk_instance_;
  pHVar2 = pHVar1->options_;
  (pHVar1->info_).store_squared_primal_infeasibility = true;
  if ((pHVar2->super_HighsOptionsStruct).less_infeasible_DSE_check == true) {
    bVar3 = isLessInfeasibleDSECandidate
                      (&(pHVar2->super_HighsOptionsStruct).log_options,&pHVar1->lp_);
    if ((bVar3) && ((pHVar2->super_HighsOptionsStruct).less_infeasible_DSE_choose_row == true)) {
      (pHVar1->info_).store_squared_primal_infeasibility = false;
    }
  }
  return;
}

Assistant:

void HEkkDual::possiblyUseLiDualSteepestEdge() {
  // Decide whether to use LiDSE by not storing squared primal infeasibilities
  HighsOptions& options = *ekk_instance_.options_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  info.store_squared_primal_infeasibility = true;
  if (options.less_infeasible_DSE_check) {
    if (isLessInfeasibleDSECandidate(options.log_options, ekk_instance_.lp_)) {
      // LP is a candidate for LiDSE
      if (options.less_infeasible_DSE_choose_row)
        // Use LiDSE
        info.store_squared_primal_infeasibility = false;
    }
  }
}